

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O1

Layer * __thiscall ModelWriter::create_custom_layer(ModelWriter *this,char *type)

{
  Layer *pLVar1;
  undefined8 local_20;
  
  pLVar1 = ncnn::Net::create_custom_layer(&this->super_Net,type);
  if (pLVar1 == (Layer *)0x0) {
    create_custom_layer();
    pLVar1 = local_20;
  }
  return pLVar1;
}

Assistant:

ncnn::Layer* ModelWriter::create_custom_layer(const char* type)
{
    ncnn::Layer* layer = Net::create_custom_layer(type);
    if (layer)
        return layer;

    fprintf(stderr, "create_custom_layer %s\n", type);

    register_custom_layer(type, CustomLayer_layer_creator);

    has_custom_layer = true;

    return Net::create_custom_layer(type);
}